

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::ParseFormatPrecision(char *fmt,int default_precision)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  
  do {
    pcVar2 = strchr(fmt,0x25);
    if (pcVar2 == (char *)0x0) {
      return default_precision;
    }
    cVar3 = pcVar2[1];
    fmt = pcVar2 + 2;
  } while (cVar3 == '%');
  while ((byte)(cVar3 - 0x30U) < 10) {
    cVar3 = *fmt;
    fmt = fmt + 1;
  }
  if ((cVar3 == '.') && (uVar1 = atoi(fmt), uVar1 < 0xb)) {
    default_precision = uVar1;
  }
  return default_precision;
}

Assistant:

int ImGui::ParseFormatPrecision(const char* fmt, int default_precision)
{
    int precision = default_precision;
    while ((fmt = strchr(fmt, '%')) != NULL)
    {
        fmt++;
        if (fmt[0] == '%') { fmt++; continue; } // Ignore "%%"
        while (*fmt >= '0' && *fmt <= '9')
            fmt++;
        if (*fmt == '.')
        {
            precision = atoi(fmt + 1);
            if (precision < 0 || precision > 10)
                precision = default_precision;
        }
        break;
    }
    return precision;
}